

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

VkClearValue vkt::synchronization::anon_unknown_0::makeClearValue(VkFormat format)

{
  bool bVar1;
  VkClearValue VVar2;
  undefined1 auStack_18 [4];
  VkFormat format_local;
  
  bVar1 = ::vk::isDepthStencilFormat(format);
  if (bVar1) {
    _auStack_18 = ::vk::makeClearValueDepthStencil(0.4,0x15);
  }
  else {
    bVar1 = ::vk::isIntFormat(format);
    if ((!bVar1) && (bVar1 = ::vk::isUintFormat(format), !bVar1)) {
      VVar2 = ::vk::makeClearValueColorF32(0.25,0.49,0.75,1.0);
      return VVar2;
    }
    _auStack_18 = ::vk::makeClearValueColorU32(8,0x10,0x18,0x20);
  }
  return _auStack_18;
}

Assistant:

VkClearValue makeClearValue (const VkFormat format)
{
	if (isDepthStencilFormat(format))
		return makeClearValueDepthStencil(0.4f, 21u);
	else
	{
		if (isIntFormat(format) || isUintFormat(format))
			return makeClearValueColorU32(8u, 16u, 24u, 32u);
		else
			return makeClearValueColorF32(0.25f, 0.49f, 0.75f, 1.0f);
	}
}